

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O0

HdlcByte * __thiscall
HdlcAnalyzer::ProcessFlags(HdlcByte *__return_storage_ptr__,HdlcAnalyzer *this)

{
  element_type *peVar1;
  HdlcByte *addressByte;
  HdlcByte local_40;
  HdlcByte local_28;
  HdlcAnalyzer *local_10;
  HdlcAnalyzer *this_local;
  
  local_10 = this;
  peVar1 = std::auto_ptr<HdlcAnalyzerSettings>::operator->(&this->mSettings);
  if (peVar1->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC) {
    BitSyncProcessFlags(this);
    this->mReadingFrame = true;
    ReadByte(&local_28,this);
    __return_storage_ptr__->startSample = local_28.startSample;
    __return_storage_ptr__->endSample = local_28.endSample;
    __return_storage_ptr__->value = local_28.value;
    __return_storage_ptr__->escaped = local_28.escaped;
    *(undefined6 *)&__return_storage_ptr__->field_0x12 = local_28._18_6_;
  }
  else {
    this->mReadingFrame = true;
    ByteAsyncProcessFlags(&local_40,this);
    __return_storage_ptr__->startSample = local_40.startSample;
    __return_storage_ptr__->endSample = local_40.endSample;
    __return_storage_ptr__->value = local_40.value;
    __return_storage_ptr__->escaped = local_40.escaped;
    *(undefined6 *)&__return_storage_ptr__->field_0x12 = local_40._18_6_;
  }
  return __return_storage_ptr__;
}

Assistant:

HdlcByte HdlcAnalyzer::ProcessFlags()
{
    HdlcByte addressByte;
    if( mSettings->mTransmissionMode == HDLC_TRANSMISSION_BIT_SYNC )
    {
        BitSyncProcessFlags();
        mReadingFrame = true;
        addressByte = ReadByte();
    }
    else
    {
        mReadingFrame = true;
        addressByte = ByteAsyncProcessFlags();
    }

    return addressByte;
}